

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O3

uint crnlib::rg_etc1::pack_etc1_block
               (void *pETC1_block,uint *pSrc_pixels_rgba,etc1_pack_params *pack_params)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ushort *puVar21;
  long lVar22;
  int *piVar23;
  undefined8 uVar24;
  byte *pbVar25;
  bool bVar26;
  int iVar27;
  ulong *puVar28;
  byte bVar29;
  uint uVar30;
  long lVar31;
  ushort uVar32;
  uint uVar33;
  uint uVar34;
  bool bVar35;
  uint8 best_selectors [2] [8];
  color_quad_u8 subblock_pixels [8];
  results results [3];
  uint8 selectors [3] [8];
  color_quad_u8 dithered_pixels [16];
  etc1_optimizer optimizer;
  uint local_368;
  int local_364;
  int *local_350;
  ulong local_340;
  ulong local_338;
  uint local_32c;
  uint local_328;
  ulong local_310;
  byte local_308 [24];
  int *local_2f0;
  ulong local_2e8;
  uint local_2e0;
  uint local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b0;
  undefined8 local_2a8;
  ulong *local_2a0;
  ulong local_298;
  uint local_290;
  int local_28c;
  uint local_288;
  undefined1 *local_280;
  undefined1 local_278 [8];
  ulong local_270;
  uint local_268;
  uint local_264;
  uint local_260;
  undefined1 *local_258;
  ulong local_248;
  undefined4 local_240;
  uint local_23c;
  uint local_238;
  etc1_pack_params *local_230;
  byte local_228;
  ulong local_218;
  etc1_pack_params local_210;
  undefined4 local_208;
  undefined8 *local_200;
  undefined1 local_1f8;
  int *local_1f0;
  undefined4 local_1e8;
  uint uStack_1e4;
  undefined1 local_1e0;
  undefined4 local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  byte *local_1c0 [3];
  undefined4 local_1a8;
  uint local_1a4;
  undefined4 local_1a0;
  byte *local_198;
  undefined1 local_188 [8];
  undefined1 local_180 [8];
  etc1_pack_params local_178 [2];
  uint local_168 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [7] [16];
  undefined1 local_a8 [16];
  etc1_solution_coordinates local_88 [2];
  uint64 local_70;
  bool local_68;
  etc1_solution_coordinates local_60 [2];
  uint64 local_48;
  bool local_40;
  
  uVar8 = *pSrc_pixels_rgba;
  uVar20 = uVar8 >> 8;
  uVar12 = 0x10;
  while( true ) {
    uVar10 = (int)uVar12 - 1;
    uVar12 = (ulong)uVar10;
    if (pSrc_pixels_rgba[uVar12] != uVar8) break;
    if (uVar10 < 2) goto code_r0x00196434;
  }
  if (pack_params->m_dithering == true) {
    piVar16 = (int *)(local_128 + 0x10);
    puVar13 = local_168;
    local_168[0] = 0xffffffff;
    local_168[1] = 0xffffffff;
    local_168[2] = 0xffffffff;
    local_168[3] = 0xffffffff;
    local_168[4] = 0xffffffff;
    local_168[5] = 0xffffffff;
    local_168[6] = 0xffffffff;
    local_168[7] = 0xffffffff;
    local_168[8] = 0xffffffff;
    local_168[9] = 0xffffffff;
    local_168[10] = 0xffffffff;
    local_168[0xb] = 0xffffffff;
    local_168[0xc] = 0xffffffff;
    local_168[0xd] = 0xffffffff;
    local_168[0xe] = 0xffffffff;
    local_168[0xf] = 0xffffffff;
    piVar23 = (int *)local_128;
    lVar22 = 0;
    do {
      local_118[0] = (undefined1  [16])0x0;
      local_128 = (undefined1  [16])0x0;
      lVar31 = 0;
      piVar6 = piVar16;
      do {
        piVar16 = piVar23;
        piVar23 = piVar6;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31);
        bVar1 = (&DAT_001e3a68)[(long)(*piVar23 * 5 + piVar23[1] * 3 >> 4) + (ulong)bVar17];
        *(byte *)((long)puVar13 + lVar31) = bVar1;
        iVar19 = (uint)bVar17 - (uint)bVar1;
        *piVar16 = iVar19;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31 + 4);
        bVar1 = (&DAT_001e3a68)
                [(long)(piVar23[1] * 5 + piVar23[2] * 3 + iVar19 * 7 + *piVar23 >> 4) +
                 (ulong)bVar17];
        *(byte *)((long)puVar13 + lVar31 + 4) = bVar1;
        iVar19 = (uint)bVar17 - (uint)bVar1;
        piVar16[1] = iVar19;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31 + 8);
        bVar1 = (&DAT_001e3a68)
                [(long)(piVar23[2] * 5 + piVar23[3] * 3 + iVar19 * 7 + piVar23[1] >> 4) +
                 (ulong)bVar17];
        *(byte *)((long)puVar13 + lVar31 + 8) = bVar1;
        iVar19 = (uint)bVar17 - (uint)bVar1;
        piVar16[2] = iVar19;
        bVar17 = *(byte *)((long)pSrc_pixels_rgba + lVar31 + 0xc);
        bVar1 = (&DAT_001e3a68)
                [(long)(piVar23[3] * 5 + iVar19 * 7 + piVar23[2] >> 4) + (ulong)bVar17];
        *(byte *)((long)puVar13 + lVar31 + 0xc) = bVar1;
        piVar16[3] = (uint)bVar17 - (uint)bVar1;
        lVar31 = lVar31 + 0x10;
        piVar6 = piVar16;
      } while ((int)lVar31 != 0x40);
      lVar22 = lVar22 + 1;
      puVar13 = (uint *)((long)puVar13 + 1);
      pSrc_pixels_rgba = (uint *)((long)pSrc_pixels_rgba + 1);
    } while (lVar22 != 3);
    local_364 = local_1cc;
    pSrc_pixels_rgba = local_168;
    uVar8 = local_1a4;
  }
  piVar16 = (int *)0x0;
  local_88[0].m_color4 = false;
  local_88[0].m_unscaled_color.field_0 = (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  local_88[0].m_inten_table = 0;
  local_70 = 0xffffffffffffffff;
  local_68 = false;
  local_60[0].m_unscaled_color.field_0 = (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  local_60[0].m_inten_table = 0;
  local_60[0].m_color4 = false;
  local_350 = (int *)0xffffffffffffffff;
  local_48 = 0xffffffffffffffff;
  local_40 = false;
  local_128 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_1c8 = 8;
  local_1c0[0] = local_308;
  local_1a0 = 8;
  local_198 = local_308 + 8;
  local_288 = 8;
  local_280 = local_188;
  local_260 = 8;
  local_258 = local_180;
  local_238 = 8;
  local_230 = local_178;
  local_210 = *pack_params;
  local_1f8 = 0;
  local_1f0 = (int *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_1e8 = 1;
  uStack_1e4 = 0;
  local_1e0 = 0;
  local_208 = 8;
  local_200 = &local_2d8;
  bVar26 = false;
  local_2b0 = 0;
  bVar5 = false;
  bVar35 = true;
LAB_00196918:
  local_368 = 0;
  bVar4 = true;
LAB_00196922:
  piVar16 = (int *)CONCAT71((int7)((ulong)piVar16 >> 8),1);
  uVar24 = 0;
  lVar22 = 0;
  local_2f0 = (int *)0x0;
  puVar28 = &local_298;
LAB_00196939:
  local_2dc = (uint)piVar16;
  if (bVar35) {
    local_2d8 = CONCAT44(local_2d8._4_4_,pSrc_pixels_rgba[lVar22 * 2]);
    local_2d8 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 4],pSrc_pixels_rgba[lVar22 * 2]);
    uStack_2d0 = CONCAT44(uStack_2d0._4_4_,pSrc_pixels_rgba[lVar22 * 2 + 8]);
    uStack_2d0 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 0xc],pSrc_pixels_rgba[lVar22 * 2 + 8]);
    local_2c8 = CONCAT44(local_2c8._4_4_,pSrc_pixels_rgba[lVar22 * 2 + 1]);
    local_2c8 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 5],pSrc_pixels_rgba[lVar22 * 2 + 1]);
    uStack_2c0 = CONCAT44(uStack_2c0._4_4_,pSrc_pixels_rgba[lVar22 * 2 + 9]);
    uStack_2c0 = CONCAT44(pSrc_pixels_rgba[lVar22 * 2 + 0xd],pSrc_pixels_rgba[lVar22 * 2 + 9]);
  }
  else {
    local_2c8 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8 + 4);
    uStack_2c0 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8 + 4 + 2);
    local_2d8 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8);
    uStack_2d0 = *(undefined8 *)(pSrc_pixels_rgba + lVar22 * 8 + 2);
  }
  local_248 = 0xffffffffffffffff;
  if (((int)lVar22 != 0 || local_368 != 0) && 0 < (int)local_210.m_quality) {
    uVar20 = (uint)local_2d8 >> 8;
    uVar12 = 8;
    do {
      uVar10 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar10;
      if (*(uint *)((long)&local_2d8 + uVar12 * 4) != (uint)local_2d8) goto LAB_00196d9d;
    } while (1 < uVar10);
    local_2a0 = puVar28;
    local_2a8 = uVar24;
    bVar17 = bVar4 & (byte)uVar24;
    puVar13 = (uint *)0x0;
    if (bVar17 != 0) {
      puVar13 = &local_290;
    }
    uVar10 = 0xffffffff;
    puVar21 = (ushort *)0x0;
    local_340 = 1;
    local_310 = 0;
    local_32c = 0;
    local_328 = 0;
    uVar32 = 0;
    uVar12 = 0;
LAB_00196a81:
    local_218 = uVar12 + 1;
    uVar14 = (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + uVar12 * 4 + 4);
    uVar11 = uVar20 & 0xff;
    bVar1 = *(byte *)((long)&local_2d8 + uVar14);
    bVar2 = *(byte *)((long)&local_2d8 + uVar12);
    local_2e8 = (ulong)bVar2;
    uVar20 = (uint)CONCAT71((int7)((ulong)puVar21 >> 8),bVar1);
    iVar19 = -1;
LAB_00196ad1:
    iVar27 = iVar19 + (uint)bVar2;
    if (0xfe < iVar27) {
      iVar27 = 0xff;
    }
    if (iVar27 < 1) {
      iVar27 = 0;
    }
    puVar21 = &g_color8_to_etc_block_config_0_255;
    if (iVar27 != 0) {
      if (iVar27 == 0xff) {
        puVar21 = &DAT_001b2c12;
      }
      else {
        puVar21 = (ushort *)(g_color8_to_etc_block_config_1_to_254 + (long)(iVar27 + -1) * 0x18);
      }
    }
    iVar27 = iVar27 - (uint)bVar2;
    uVar9 = *puVar21;
    uVar3 = uVar32;
LAB_00196b25:
    puVar21 = puVar21 + 1;
    bVar29 = (byte)uVar9;
    local_2e0 = uVar20;
    if (bVar4 == (bool)(bVar29 & 1)) {
      uVar15 = (ulong)uVar9;
      if ((~bVar17 & 1) == 0 && (uVar9 & 1) != 0) {
        if (7 < ((uint)(uVar9 >> 8) - (uint)*(byte *)((long)puVar13 + uVar12)) + 4)
        goto LAB_00196c5d;
        uVar30 = (uVar9 & 0xff) << 9;
        uVar33 = (uint)*(ushort *)(g_etc1_inverse_lookup + (ulong)uVar11 * 2 + (ulong)uVar30);
        if ((((uVar33 & 0xff) - (uint)*(byte *)((long)puVar13 + local_340)) + 4 < 8) &&
           (uVar32 = *(ushort *)(g_etc1_inverse_lookup + (ulong)bVar1 * 2 + (ulong)uVar30),
           ((uVar32 & 0xff) - (uint)*(byte *)((long)puVar13 + uVar14)) + 4 < 8)) goto LAB_00196c0b;
        uVar9 = *puVar21;
        uVar33 = local_328;
        uVar32 = uVar3;
        goto joined_r0x00196bdf;
      }
      uVar33 = (uint)*(ushort *)(g_etc1_inverse_lookup + (ulong)uVar11 * 2 + (ulong)bVar29 * 0x200);
      uVar32 = *(ushort *)(g_etc1_inverse_lookup + (ulong)bVar1 * 2 + (ulong)bVar29 * 0x200);
LAB_00196c0b:
      uVar30 = (uint)(uVar32 >> 8) * (uint)(uVar32 >> 8) + iVar27 * iVar27 +
               (uVar33 >> 8) * (uVar33 >> 8);
      if (uVar30 < uVar10) {
        if (uVar30 != 0) {
          local_310 = uVar12 & 0xffffffff;
          local_32c = (uint)uVar9;
          local_328 = uVar33;
          uVar3 = uVar32;
          uVar10 = uVar30;
          goto LAB_00196c5d;
        }
        uVar10 = 0;
        local_310 = uVar12 & 0xffffffff;
        goto LAB_00196d17;
      }
    }
LAB_00196c5d:
    uVar9 = *puVar21;
    uVar33 = local_328;
    uVar32 = uVar3;
joined_r0x00196bdf:
    local_328 = uVar33;
    uVar3 = uVar32;
    if (uVar9 == 0xffff) goto LAB_00196c6a;
    goto LAB_00196b25;
  }
  goto LAB_00196d9d;
LAB_00196c6a:
  iVar19 = iVar19 + 1;
  if (iVar19 == 2) goto code_r0x00196c7d;
  goto LAB_00196ad1;
code_r0x00196c7d:
  uVar12 = local_218;
  local_340 = uVar14;
  if (local_218 == 3) goto code_r0x00196c96;
  goto LAB_00196a81;
code_r0x00196c96:
  uVar15 = (ulong)local_32c;
  if (uVar10 != 0xffffffff) {
LAB_00196d17:
    local_248 = (ulong)(uVar10 << 3);
    local_238 = 8;
    local_228 = ~(byte)uVar15 & 1;
    local_23c = (uint)(uVar15 >> 1) & 7;
    *local_230 = (etc1_pack_params)((ulong)((byte)((byte)uVar15 >> 4) & 3) * 0x101010101010101);
    *(char *)((long)&local_240 + local_310) = (char)(uVar15 >> 8);
    *(char *)((long)&local_240 +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + local_310 * 4)) = (char)uVar33;
    *(char *)((long)&local_240 +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + (ulong)((int)local_310 + 1) * 4)) = (char)uVar32;
  }
LAB_00196d9d:
  piVar23 = (int *)&local_210;
  local_1f8 = (undefined1)local_368;
  local_1e0 = ((byte)uVar24 & bVar4) != 0;
  if ((bool)local_1e0) {
    uStack_1e4 = local_290;
  }
  if (local_210.m_quality == cHighQuality) {
    local_1e8 = 9;
    piVar16 = pack_etc1_block::s_scan_delta_0_to_4;
  }
  else if (local_210.m_quality == cMediumQuality) {
    local_1e8 = 3;
    piVar16 = pack_etc1_block::s_scan_delta_0_to_1;
  }
  else {
    local_1e8 = 1;
    piVar16 = pack_etc1_block::s_scan_delta_0;
  }
  local_1f0 = piVar16;
  etc1_optimizer::init((etc1_optimizer *)local_128,(EVP_PKEY_CTX *)piVar23);
  bVar7 = etc1_optimizer::compute((etc1_optimizer *)local_128);
  if (!bVar7) goto LAB_00196fba;
  uVar12 = *puVar28;
  if (0 < (int)local_210.m_quality) {
    if (3000 < uVar12) {
      local_1e8 = 2;
      if (6000 < uVar12) {
        local_1e8 = 8;
      }
      local_1f0 = pack_etc1_block::s_scan_delta_5_to_5;
      piVar23 = pack_etc1_block::s_scan_delta_5_to_8;
      if (6000 < uVar12) {
        local_1f0 = pack_etc1_block::s_scan_delta_5_to_8;
      }
      if (local_210.m_quality == cMediumQuality) {
        local_1e8 = 4;
      }
      piVar16 = pack_etc1_block::s_scan_delta_2_to_3;
      if (local_210.m_quality == cMediumQuality) {
        local_1f0 = pack_etc1_block::s_scan_delta_2_to_3;
      }
      bVar7 = etc1_optimizer::compute((etc1_optimizer *)local_128);
      if (!bVar7) goto LAB_00196fba;
      uVar12 = *puVar28;
    }
    if (local_248 < uVar12) {
      *(undefined4 *)(puVar28 + 1) = local_240;
      *(byte *)(puVar28 + 4) = local_228;
      *(uint *)((long)puVar28 + 0xc) = local_23c;
      *puVar28 = local_248;
      piVar23 = (int *)local_230;
      memcpy((void *)puVar28[3],local_230,(ulong)local_238);
      uVar12 = *puVar28;
    }
  }
  local_2f0 = (int *)((long)local_2f0 + uVar12);
  piVar16 = local_2f0;
  if (local_350 <= local_2f0) goto LAB_00196fba;
  lVar22 = 1;
  uVar24 = CONCAT71((int7)((ulong)piVar23 >> 8),1);
  piVar16 = (int *)0x0;
  puVar28 = (ulong *)(local_278 + 8);
  if ((local_2dc & 1) == 0) goto code_r0x00196f38;
  goto LAB_00196939;
code_r0x00196f38:
  local_1d0 = local_290;
  local_364 = local_28c;
  memcpy(local_308,local_280,(ulong)local_288);
  uVar8 = local_264;
  local_1a8 = local_268;
  memcpy(local_308 + 8,local_258,(ulong)local_260);
  local_2b0 = (ulong)local_368;
  local_350 = local_2f0;
  bVar26 = bVar5;
LAB_00196fba:
  local_368 = 1;
  bVar7 = !bVar4;
  bVar4 = false;
  if (bVar7) goto code_r0x00196fd1;
  goto LAB_00196922;
code_r0x00196fd1:
  bVar5 = true;
  bVar4 = !bVar35;
  bVar35 = false;
  if (bVar4) goto code_r0x00196fec;
  goto LAB_00196918;
code_r0x00196fec:
  if ((int)local_2b0 == 0) {
    iVar19 = (local_1a8 & 0xff) - (local_1d0 & 0xff);
    local_1a8._0_1_ = (char)local_1d0 << 3 | (char)iVar19 + (char)(iVar19 >> 0x1f) * -8;
    local_1a8._1_1_ =
         local_1d0._1_1_ << 3 |
         (char)((uint)local_1a8._1_1_ - (uint)local_1d0._1_1_) +
         (char)((int)((uint)local_1a8._1_1_ - (uint)local_1d0._1_1_) >> 0x1f) * -8;
    local_1a8._2_1_ =
         local_1d0._2_1_ << 3 |
         (char)((uint)local_1a8._2_1_ - (uint)local_1d0._2_1_) +
         (char)((int)((uint)local_1a8._2_1_ - (uint)local_1d0._2_1_) >> 0x1f) * -8;
  }
  else {
    local_1a8._0_1_ = (char)local_1d0 << 4 | (byte)local_1a8;
    local_1a8._1_1_ = local_1d0._1_1_ << 4 | local_1a8._1_1_;
    local_1a8._2_1_ = local_1d0._2_1_ << 4 | local_1a8._2_1_;
  }
  *(byte *)pETC1_block = (byte)local_1a8;
  *(byte *)((long)pETC1_block + 1) = local_1a8._1_1_;
  *(byte *)((long)pETC1_block + 2) = local_1a8._2_1_;
  *(byte *)((long)pETC1_block + 3) =
       (((char)local_2b0 * '\x02' & 2U) + (char)uVar8 * '\x04' | (byte)(local_364 << 5)) ^ 2 |
       bVar26;
  if (bVar26) {
    lVar22 = 0;
    uVar32 = 0;
    uVar9 = 0;
    do {
      uVar3 = (ushort)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 0xf]) *
              2;
      uVar9 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 3]) & 1 |
              (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 0xb]) & 1 |
              (uVar3 & 2) + uVar9 * 4) * 4 +
              (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 7]) & 1) * 2;
      uVar32 = (ushort)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 3]) >>
                       1) |
               *(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 7]) & 0xfffe |
               (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)local_308[lVar22 + 0xb]) & 0xfffe
                | uVar32 << 3 | uVar3 & 0xfffc) * 2;
      lVar22 = lVar22 + -1;
    } while (lVar22 != -4);
  }
  else {
    uVar8 = 0;
    lVar22 = 1;
    uVar20 = 0;
    do {
      pbVar25 = local_1c0[lVar22 * 5] + 7;
      bVar35 = true;
      do {
        bVar26 = bVar35;
        uVar10 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)*pbVar25) * 2;
        uVar20 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-3]) & 1 |
                 (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-1]) & 1 |
                 (uVar10 & 2) + uVar20 * 4) * 4 +
                 (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-2]) & 1) * 2;
        uVar9 = (ushort)uVar20;
        uVar8 = (uint)(*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-3]) >> 1) |
                *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-2]) & 0xfffffffe |
                (*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pbVar25[-1]) & 0xfffffffe |
                 uVar8 << 3 | uVar10 & 0xfffffffc) * 2;
        uVar32 = (ushort)uVar8;
        pbVar25 = pbVar25 + -4;
        bVar35 = false;
      } while (bVar26);
      bVar35 = lVar22 != 0;
      lVar22 = lVar22 + -1;
    } while (bVar35);
  }
  *(char *)((long)pETC1_block + 4) = (char)(uVar32 >> 8);
  *(char *)((long)pETC1_block + 5) = (char)uVar32;
  *(char *)((long)pETC1_block + 6) = (char)(uVar9 >> 8);
  *(char *)((long)pETC1_block + 7) = (char)uVar9;
  goto LAB_00197220;
code_r0x00196434:
  uVar8 = 0xffffffff;
  local_338 = 0;
  uVar33 = 0;
  uVar11 = 0;
  uVar10 = 0;
  uVar12 = 0;
  do {
    uVar14 = uVar12 + 1;
    bVar17 = (byte)uVar20;
    uVar20 = (uint)*(byte *)((long)pSrc_pixels_rgba +
                            (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                             ::s_next_comp + uVar12 * 4 + 4));
    iVar19 = -1;
    do {
      iVar27 = iVar19 + (uint)*(byte *)((long)pSrc_pixels_rgba + uVar12);
      if (0xfe < iVar27) {
        iVar27 = 0xff;
      }
      if (iVar27 < 1) {
        iVar27 = 0;
      }
      puVar21 = &g_color8_to_etc_block_config_0_255;
      if (iVar27 != 0) {
        if (iVar27 == 0xff) {
          puVar21 = &DAT_001b2c12;
        }
        else {
          puVar21 = (ushort *)(g_color8_to_etc_block_config_1_to_254 + (long)(iVar27 + -1) * 0x18);
        }
      }
      iVar27 = iVar27 - (uint)*(byte *)((long)pSrc_pixels_rgba + uVar12);
      uVar32 = *puVar21;
      uVar30 = uVar33;
      do {
        puVar21 = puVar21 + 1;
        uVar33 = (uint)uVar32;
        uVar18 = (uVar33 & 0xff) << 9;
        uVar32 = *(ushort *)(g_etc1_inverse_lookup + (ulong)bVar17 * 2 + (ulong)uVar18);
        uVar9 = *(ushort *)
                 (g_etc1_inverse_lookup +
                 (ulong)*(byte *)((long)pSrc_pixels_rgba +
                                 (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                                  ::s_next_comp + uVar12 * 4 + 4)) * 2 +
                 (ulong)uVar18);
        uVar34 = (uint)(uVar32 >> 8);
        uVar18 = (uint)(uVar9 >> 8);
        uVar18 = uVar18 * uVar18 + uVar34 * uVar34 + iVar27 * iVar27;
        if (uVar18 < uVar8) {
          uVar11 = uVar32 & 0xff;
          uVar10 = uVar9 & 0xff;
          if (uVar18 == 0) {
            local_350 = (int *)0x0;
            goto LAB_00196766;
          }
          local_338 = uVar12 & 0xffffffff;
          uVar8 = uVar18;
          uVar30 = uVar33;
        }
        uVar33 = uVar30;
        uVar32 = *puVar21;
        uVar30 = uVar33;
      } while (uVar32 != 0xffff);
      iVar19 = iVar19 + 1;
    } while (iVar19 != 2);
    uVar12 = uVar14;
  } while (uVar14 != 3);
  local_350 = (int *)(ulong)(uVar8 << 4);
  uVar12 = local_338;
LAB_00196766:
  *(byte *)((long)pETC1_block + 3) =
       ((char)uVar33 * '\x02' & 0x1cU) * '\t' + (char)(uVar33 & 1) * '\x02';
  bVar17 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)(uVar33 >> 4 & 3));
  *(short *)((long)pETC1_block + 4) = (short)((int)((uint)bVar17 << 0x1e) >> 0x1f);
  *(ushort *)((long)pETC1_block + 6) = -(bVar17 & 1);
  if ((uVar33 & 1) == 0) {
    *(byte *)((long)pETC1_block + (uVar12 & 0xffffffff)) =
         (byte)((uVar33 >> 8) << 4) | (byte)(uVar33 >> 8);
    *(byte *)((long)pETC1_block +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + (uVar12 & 0xffffffff) * 4)) =
         (byte)(uVar11 << 4) | (byte)uVar11;
    bVar17 = (byte)(uVar10 << 4) | (byte)uVar10;
  }
  else {
    *(char *)((long)pETC1_block + (uVar12 & 0xffffffff)) = (char)((uVar33 >> 8) << 3);
    *(byte *)((long)pETC1_block +
             (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp + (uVar12 & 0xffffffff) * 4)) = (byte)uVar11 << 3;
    bVar17 = (byte)uVar10 << 3;
  }
  *(byte *)((long)pETC1_block +
           (ulong)*(uint *)(pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                            ::s_next_comp + (ulong)((int)uVar12 + 1) * 4)) = bVar17;
LAB_00197220:
  return (uint)local_350;
}

Assistant:

unsigned int pack_etc1_block(void* pETC1_block, const unsigned int* pSrc_pixels_rgba, etc1_pack_params& pack_params)
        {
            const color_quad_u8* pSrc_pixels = reinterpret_cast<const color_quad_u8*>(pSrc_pixels_rgba);
            etc1_block& dst_block = *static_cast<etc1_block*>(pETC1_block);

            color_quad_u8 src_pixel0(pSrc_pixels[0]);

            // Check for solid block.
            const uint32 first_pixel_u32 = pSrc_pixels->m_u32;
            int r;
            for (r = 15; r >= 1; --r)
            {
                if (pSrc_pixels[r].m_u32 != first_pixel_u32)
                {
                    break;
                }
            }

            if (!r)
            {
                return static_cast<unsigned int>(16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r));
            }

            color_quad_u8 dithered_pixels[16];
            if (pack_params.m_dithering)
            {
                dither_block_555(dithered_pixels, pSrc_pixels);
                pSrc_pixels = dithered_pixels;
            }

            etc1_optimizer optimizer;

            uint64 best_error = cUINT64_MAX;
            uint best_flip = false, best_use_color4 = false;

            uint8 best_selectors[2][8];
            etc1_optimizer::results best_results[2];
            for (uint i = 0; i < 2; i++)
            {
                best_results[i].m_n = 8;
                best_results[i].m_pSelectors = best_selectors[i];
            }

            uint8 selectors[3][8];
            etc1_optimizer::results results[3];

            for (uint i = 0; i < 3; i++)
            {
                results[i].m_n = 8;
                results[i].m_pSelectors = selectors[i];
            }

            color_quad_u8 subblock_pixels[8];

            etc1_optimizer::params params(pack_params);
            params.m_num_src_pixels = 8;
            params.m_pSrc_pixels = subblock_pixels;

            for (uint flip = 0; flip < 2; flip++)
            {
                for (uint use_color4 = 0; use_color4 < 2; use_color4++)
                {
                    uint64 trial_error = 0;

                    uint subblock;
                    for (subblock = 0; subblock < 2; subblock++)
                    {
                        if (flip)
                        {
                            memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
                        }
                        else
                        {
                            const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
                            subblock_pixels[0] = pSrc_col[0];
                            subblock_pixels[1] = pSrc_col[4];
                            subblock_pixels[2] = pSrc_col[8];
                            subblock_pixels[3] = pSrc_col[12];
                            subblock_pixels[4] = pSrc_col[1];
                            subblock_pixels[5] = pSrc_col[5];
                            subblock_pixels[6] = pSrc_col[9];
                            subblock_pixels[7] = pSrc_col[13];
                        }

                        results[2].m_error = cUINT64_MAX;
                        if ((params.m_quality >= cMediumQuality) && ((subblock) || (use_color4)))
                        {
                            const uint32 subblock_pixel0_u32 = subblock_pixels[0].m_u32;
                            for (r = 7; r >= 1; --r)
                            {
                                if (subblock_pixels[r].m_u32 != subblock_pixel0_u32)
                                {
                                    break;
                                }
                            }
                            if (!r)
                            {
                                pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixels[0].r, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : nullptr);
                            }
                        }

                        params.m_use_color4 = (use_color4 != 0);
                        params.m_constrain_against_base_color5 = false;

                        if ((!use_color4) && (subblock))
                        {
                            params.m_constrain_against_base_color5 = true;
                            params.m_base_color5 = results[0].m_block_color_unscaled;
                        }

                        if (params.m_quality == cHighQuality)
                        {
                            static const int s_scan_delta_0_to_4[] = { -4, -3, -2, -1, 0, 1, 2, 3, 4 };
                            params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_4);
                            params.m_pScan_deltas = s_scan_delta_0_to_4;
                        }
                        else if (params.m_quality == cMediumQuality)
                        {
                            static const int s_scan_delta_0_to_1[] = { -1, 0, 1 };
                            params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_1);
                            params.m_pScan_deltas = s_scan_delta_0_to_1;
                        }
                        else
                        {
                            static const int s_scan_delta_0[] = { 0 };
                            params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0);
                            params.m_pScan_deltas = s_scan_delta_0;
                        }

                        optimizer.init(params, results[subblock]);
                        if (!optimizer.compute())
                        {
                            break;
                        }

                        if (params.m_quality >= cMediumQuality)
                        {
                            // TODO: Fix fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
                            const uint refinement_error_thresh0 = 3000;
                            const uint refinement_error_thresh1 = 6000;
                            if (results[subblock].m_error > refinement_error_thresh0)
                            {
                                if (params.m_quality == cMediumQuality)
                                {
                                    static const int s_scan_delta_2_to_3[] = { -3, -2, 2, 3 };
                                    params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_2_to_3);
                                    params.m_pScan_deltas = s_scan_delta_2_to_3;
                                }
                                else
                                {
                                    static const int s_scan_delta_5_to_5[] = { -5, 5 };
                                    static const int s_scan_delta_5_to_8[] = { -8, -7, -6, -5, 5, 6, 7, 8 };
                                    if (results[subblock].m_error > refinement_error_thresh1)
                                    {
                                        params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_8);
                                        params.m_pScan_deltas = s_scan_delta_5_to_8;
                                    }
                                    else
                                    {
                                        params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_5);
                                        params.m_pScan_deltas = s_scan_delta_5_to_5;
                                    }
                                }

                                if (!optimizer.compute())
                                {
                                    break;
                                }
                            }

                            if (results[2].m_error < results[subblock].m_error)
                            {
                                results[subblock] = results[2];
                            }
                        }

                        trial_error += results[subblock].m_error;
                        if (trial_error >= best_error)
                        {
                            break;
                        }
                    }

                    if (subblock < 2)
                    {
                        continue;
                    }

                    best_error = trial_error;
                    best_results[0] = results[0];
                    best_results[1] = results[1];
                    best_flip = flip;
                    best_use_color4 = use_color4;

                } // use_color4

            } // flip

            int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
            int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
            int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
            RG_ETC1_ASSERT(best_use_color4 || (rg_etc1::minimum(dr, dg, db) >= cETC1ColorDeltaMin) && (rg_etc1::maximum(dr, dg, db) <= cETC1ColorDeltaMax));

            if (best_use_color4)
            {
                dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
                dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
                dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
            }
            else
            {
                if (dr < 0)
                {
                    dr += 8;
                }
                dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
                if (dg < 0)
                {
                    dg += 8;
                }
                dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
                if (db < 0)
                {
                    db += 8;
                }
                dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
            }

            dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

            uint selector0 = 0, selector1 = 0;
            if (best_flip)
            {
                // flipped:
                // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
                // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
                //
                // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
                // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
                const uint8* pSelectors0 = best_results[0].m_pSelectors;
                const uint8* pSelectors1 = best_results[1].m_pSelectors;
                for (int x = 3; x >= 0; --x)
                {
                    uint b;
                    b = g_selector_index_to_etc1[pSelectors1[4 + x]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors1[x]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors0[4 + x]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);

                    b = g_selector_index_to_etc1[pSelectors0[x]];
                    selector0 = (selector0 << 1) | (b & 1);
                    selector1 = (selector1 << 1) | (b >> 1);
                }
            }
            else
            {
                // non-flipped:
                // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
                // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
                //
                // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
                // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
                for (int subblock = 1; subblock >= 0; --subblock)
                {
                    const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
                    for (uint i = 0; i < 2; i++)
                    {
                        uint b;
                        b = g_selector_index_to_etc1[pSelectors[3]];
                        selector0 = (selector0 << 1) | (b & 1);
                        selector1 = (selector1 << 1) | (b >> 1);

                        b = g_selector_index_to_etc1[pSelectors[2]];
                        selector0 = (selector0 << 1) | (b & 1);
                        selector1 = (selector1 << 1) | (b >> 1);

                        b = g_selector_index_to_etc1[pSelectors[1]];
                        selector0 = (selector0 << 1) | (b & 1);
                        selector1 = (selector1 << 1) | (b >> 1);

                        b = g_selector_index_to_etc1[pSelectors[0]];
                        selector0 = (selector0 << 1) | (b & 1);
                        selector1 = (selector1 << 1) | (b >> 1);

                        pSelectors -= 4;
                    }
                }
            }

            dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
            dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
            dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
            dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

            return static_cast<unsigned int>(best_error);
        }